

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

unsigned_long tjBufSize(int width,int height,int jpegSubsamp)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long in_FS_OFFSET;
  
  if ((height < 1 || width < 1) || 5 < (uint)jpegSubsamp) {
    builtin_strncpy((char *)(in_FS_OFFSET + -0xc2),"nvalid a",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -0xba),"rgument",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -0xd0),"tjBufSiz",8);
    builtin_strncpy((char *)(in_FS_OFFSET + -200),"e(): Inv",8);
    return 0xffffffffffffffff;
  }
  iVar1 = tjMCUWidth[(uint)jpegSubsamp];
  iVar2 = tjMCUHeight[(uint)jpegSubsamp];
  lVar3 = 2;
  if (jpegSubsamp != 3) {
    lVar3 = (long)((int)(0x100 / (long)(iVar2 * iVar1)) + 2);
  }
  return (int)((-iVar2 & (height + iVar2) - 1U) * (-iVar1 & (width + iVar1) - 1U)) * lVar3 + 0x800;
}

Assistant:

DLLEXPORT unsigned long tjBufSize(int width, int height, int jpegSubsamp)
{
  unsigned long long retval = 0;
  int mcuw, mcuh, chromasf;

  if (width < 1 || height < 1 || jpegSubsamp < 0 || jpegSubsamp >= NUMSUBOPT)
    THROWG("tjBufSize(): Invalid argument");

  /* This allows for rare corner cases in which a JPEG image can actually be
     larger than the uncompressed input (we wouldn't mention it if it hadn't
     happened before.) */
  mcuw = tjMCUWidth[jpegSubsamp];
  mcuh = tjMCUHeight[jpegSubsamp];
  chromasf = jpegSubsamp == TJSAMP_GRAY ? 0 : 4 * 64 / (mcuw * mcuh);
  retval = PAD(width, mcuw) * PAD(height, mcuh) * (2ULL + chromasf) + 2048ULL;
  if (retval > (unsigned long long)((unsigned long)-1))
    THROWG("tjBufSize(): Image is too large");

bailout:
  return (unsigned long)retval;
}